

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O3

bool __thiscall duckdb::PivotColumn::Equals(PivotColumn *this,PivotColumn *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  size_t __n;
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  int iVar4;
  const_reference this_00;
  const_reference other_00;
  size_type __n_00;
  
  bVar3 = ExpressionUtil::ListEquals(&this->pivot_expressions,&other->pivot_expressions);
  if (bVar3) {
    __first1 = (other->unpivot_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (other->unpivot_names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (this->unpivot_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((((long)__last1 - (long)__first1 ==
           (long)(this->unpivot_names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
         (bVar3 = ::std::__equal<false>::
                  equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                            (__first1,__last1,__first2), bVar3)) &&
        (__n = (other->pivot_enum)._M_string_length, __n == (this->pivot_enum)._M_string_length)) &&
       ((__n == 0 ||
        (iVar4 = bcmp((other->pivot_enum)._M_dataplus._M_p,(this->pivot_enum)._M_dataplus._M_p,__n),
        iVar4 == 0)))) {
      pPVar1 = (this->entries).
               super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (this->entries).
               super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)(other->entries).
                super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
                super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(other->entries).
                super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
                super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                ._M_impl.super__Vector_impl_data._M_start == (long)pPVar2 - (long)pPVar1) {
        if (pPVar2 == pPVar1) {
          return true;
        }
        __n_00 = 0;
        do {
          this_00 = vector<duckdb::PivotColumnEntry,_true>::operator[](&this->entries,__n_00);
          other_00 = vector<duckdb::PivotColumnEntry,_true>::operator[](&other->entries,__n_00);
          bVar3 = PivotColumnEntry::Equals(this_00,other_00);
          if (!bVar3) {
            return bVar3;
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(this->entries).
                                        super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                                        .
                                        super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->entries).
                                        super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                                        .
                                        super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 6));
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool PivotColumn::Equals(const PivotColumn &other) const {
	if (!ExpressionUtil::ListEquals(pivot_expressions, other.pivot_expressions)) {
		return false;
	}
	if (other.unpivot_names != unpivot_names) {
		return false;
	}
	if (other.pivot_enum != pivot_enum) {
		return false;
	}
	if (other.entries.size() != entries.size()) {
		return false;
	}
	for (idx_t i = 0; i < entries.size(); i++) {
		if (!entries[i].Equals(other.entries[i])) {
			return false;
		}
	}
	return true;
}